

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O2

void __thiscall wabt::anon_unknown_0::CWriter::WriteExports(CWriter *this,CWriterPhase kind)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  size_t *psVar2;
  Type *pTVar3;
  bool bVar4;
  Index IVar5;
  Func *pFVar6;
  Memory *this_00;
  Global *pGVar7;
  Table *pTVar8;
  pointer pTVar9;
  uint uVar10;
  uint *args;
  char (*u) [5];
  Newline *extraout_RDX;
  Memory *memory;
  Newline *extraout_RDX_00;
  char (*extraout_RDX_01) [2];
  char (*extraout_RDX_02) [2];
  Newline *u_00;
  ExternalInstancePtr *extraout_RDX_03;
  ExternalInstancePtr *extraout_RDX_04;
  ExternalInstancePtr *extraout_RDX_05;
  ExternalInstancePtr *u_01;
  Newline *u_02;
  Newline *extraout_RDX_06;
  char (*extraout_RDX_07) [2];
  char (*u_03) [2];
  GlobalName *u_04;
  Newline *pNVar11;
  Newline *extraout_RDX_08;
  Newline *extraout_RDX_09;
  Newline *extraout_RDX_10;
  Newline *extraout_RDX_11;
  Index i;
  ulong uVar12;
  string *t;
  char *t_00;
  Newline *in_R8;
  long lVar13;
  string_view str;
  string_view export_name;
  string local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e8;
  StackVarSymbolMap *local_e0;
  SymbolMap *local_d8;
  string mangled_name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  index_to_name;
  string internal_name;
  string local_50;
  
  args = (uint *)(this->module_->exports).
                 super__Vector_base<wabt::Export_*,_std::allocator<wabt::Export_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
  pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (this->module_->exports).
           super__Vector_base<wabt::Export_*,_std::allocator<wabt::Export_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args != pbVar1) {
    local_d8 = &this->local_sym_map_;
    local_e0 = &this->stack_var_sym_map_;
    for (local_e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args;
        local_e8 != pbVar1;
        local_e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &local_e8->_M_string_length) {
      psVar2 = (size_t *)(local_e8->_M_dataplus)._M_p;
      str._M_str = (char *)args;
      str._M_len = *psVar2;
      (anonymous_namespace)::SanitizeForComment_abi_cxx11_
                (&local_108,(_anonymous_namespace_ *)psVar2[1],str);
      Write(this);
      WriteData(this,"/* export: \'",0xc);
      (anonymous_namespace)::CWriter::
      Write<std::__cxx11::string,char_const(&)[5],wabt::(anonymous_namespace)::Newline>
                ((CWriter *)this,&local_108,u,(Newline *)args);
      std::__cxx11::string::_M_dispose();
      export_name._M_str = (char *)*psVar2;
      export_name._M_len = psVar2[1];
      (anonymous_namespace)::CWriter::ExportName_abi_cxx11_
                (&mangled_name,(CWriter *)this,export_name);
      internal_name._M_dataplus._M_p = (pointer)&internal_name.field_2;
      internal_name._M_string_length = 0;
      index_to_name.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      internal_name.field_2._M_local_buf[0] = '\0';
      index_to_name.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      index_to_name.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      args = &switchD_001403ff::switchdataD_0016aa98;
      switch((int)psVar2[4]) {
      case 0:
        pFVar6 = Module::GetFunc(this->module_,(Var *)(psVar2 + 5));
        std::__cxx11::string::_M_assign((string *)&internal_name);
        if (kind == Declarations) {
          WriteFuncDeclaration(this,&pFVar6->decl,&mangled_name);
          pNVar11 = extraout_RDX_06;
          goto LAB_001407ce;
        }
        this->func_ = pFVar6;
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator=(&(this->local_syms_)._M_t,&(this->global_syms_)._M_t);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::clear(&local_d8->_M_t);
        std::
        _Rb_tree<std::pair<unsigned_int,_wabt::Type>,_std::pair<const_std::pair<unsigned_int,_wabt::Type>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::pair<unsigned_int,_wabt::Type>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::pair<unsigned_int,_wabt::Type>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_wabt::Type>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::clear(&local_e0->_M_t);
        (anonymous_namespace)::CWriter::
        Write<std::vector<wabt::Type,std::allocator<wabt::Type>>const&,char_const(&)[2],std::__cxx11::string_const&,char_const(&)[2]>
                  ((CWriter *)this,&(this->func_->decl).sig.result_types,(char (*) [2])&mangled_name
                   ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args,
                   (char (*) [2])in_R8);
        IVar5 = Func::GetNumParamsAndLocals(this->func_);
        MakeTypeBindingReverseMapping((ulong)IVar5,&this->func_->bindings,&index_to_name);
        WriteParams(this,&index_to_name,false);
        goto LAB_00140686;
      case 1:
        pTVar8 = Module::GetTable(this->module_,(Var *)(psVar2 + 5));
        std::__cxx11::string::_M_assign((string *)&internal_name);
        WriteTableType(this,&pTVar8->elem_type);
        (anonymous_namespace)::CWriter::ModuleInstanceTypeName_abi_cxx11_
                  (&local_108,(CWriter *)this);
        WriteData(this,"* ",2);
        WriteData(this,mangled_name._M_dataplus._M_p,mangled_name._M_string_length);
        WriteData(this,"(",1);
        WriteData(this,local_108._M_dataplus._M_p,local_108._M_string_length);
        WriteData(this,"* instance)",0xb);
        break;
      case 2:
        this_00 = Module::GetMemory(this->module_,(Var *)(psVar2 + 5));
        std::__cxx11::string::_M_assign((string *)&internal_name);
        (anonymous_namespace)::GetMemoryTypeString_abi_cxx11_
                  (&local_108,(_anonymous_namespace_ *)this_00,memory);
        (anonymous_namespace)::CWriter::ModuleInstanceTypeName_abi_cxx11_(&local_50,(CWriter *)this)
        ;
        WriteData(this,local_108._M_dataplus._M_p,local_108._M_string_length);
        WriteData(this,"* ",2);
        (anonymous_namespace)::CWriter::
        Write<std::__cxx11::string_const&,char_const(&)[2],std::__cxx11::string,char_const(&)[12]>
                  ((CWriter *)this,&mangled_name,(char (*) [2])&local_50,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args,
                   (char (*) [12])in_R8);
        std::__cxx11::string::_M_dispose();
        break;
      case 3:
        pGVar7 = Module::GetGlobal(this->module_,(Var *)(psVar2 + 5));
        std::__cxx11::string::_M_assign((string *)&internal_name);
        (anonymous_namespace)::CWriter::ModuleInstanceTypeName_abi_cxx11_
                  (&local_108,(CWriter *)this);
        Write(this,pGVar7->type);
        WriteData(this,"* ",2);
        (anonymous_namespace)::CWriter::
        Write<std::__cxx11::string_const&,char_const(&)[2],std::__cxx11::string,char_const(&)[12]>
                  ((CWriter *)this,&mangled_name,(char (*) [2])&local_108,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args,
                   (char (*) [12])in_R8);
        break;
      case 4:
        Module::GetTag(this->module_,(Var *)(psVar2 + 5));
        std::__cxx11::string::_M_assign((string *)&internal_name);
        if (kind == Declarations) {
          WriteData(this,"extern ",7);
        }
        WriteData(this,"const wasm_rt_tag_t ",0x14);
        WriteData(this,mangled_name._M_dataplus._M_p,mangled_name._M_string_length);
        pNVar11 = extraout_RDX;
        goto LAB_0014067d;
      default:
        goto switchD_001403ff_default;
      }
      std::__cxx11::string::_M_dispose();
      pNVar11 = extraout_RDX_00;
LAB_0014067d:
      if (kind == Declarations) {
LAB_001407ce:
        (anonymous_namespace)::CWriter::Write<char_const(&)[2],wabt::(anonymous_namespace)::Newline>
                  ((CWriter *)this,(char (*) [2])0x16c477,pNVar11);
        goto LAB_00140974;
      }
LAB_00140686:
      WriteData(this," ",1);
      args = &switchD_001406b8::switchdataD_0016aaac;
      switch((int)psVar2[4]) {
      case 0:
        Write(this);
        bVar4 = IsSingleUnsharedMemory(this);
        u_03 = extraout_RDX_01;
        if (bVar4) {
          InstallSegueBase(this,*(this->module_->memories).
                                 super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start,true);
          u_03 = extraout_RDX_02;
        }
        pFVar6 = this->func_;
        pTVar3 = (pFVar6->decl).sig.result_types.
                 super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar10 = (uint)((ulong)((long)(pFVar6->decl).sig.result_types.
                                      super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                                      _M_impl.super__Vector_impl_data._M_finish - (long)pTVar3) >> 3
                       );
        if (uVar10 < 2) {
          if (uVar10 == 1) {
            Write(this,*pTVar3);
            goto LAB_001407f2;
          }
        }
        else {
          Write(this,&(pFVar6->decl).sig.result_types);
LAB_001407f2:
          WriteData(this," ret = ",7);
          u_03 = extraout_RDX_07;
        }
        local_108._M_dataplus._M_p = local_108._M_dataplus._M_p & 0xffffffff00000000;
        local_108._M_string_length = (size_type)&internal_name;
        (anonymous_namespace)::CWriter::
        Write<wabt::(anonymous_namespace)::ExternalRef,char_const(&)[2]>
                  ((CWriter *)this,(ExternalRef *)&local_108,u_03);
        bVar4 = IsImport(this,&internal_name);
        if (bVar4) {
          local_108._M_string_length =
               (size_type)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&this->import_module_sym_map_,&internal_name);
          local_108._M_dataplus._M_p._0_4_ = 2;
          (anonymous_namespace)::CWriter::
          Write<char_const(&)[11],wabt::(anonymous_namespace)::GlobalName>
                    ((CWriter *)this,(char (*) [11])&local_108,u_04);
        }
        else {
          WriteData(this,"instance",8);
        }
        args = (uint *)(this->func_->decl).sig.param_types.
                       super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                       super__Vector_impl_data._M_start;
        pTVar9 = (this->func_->decl).sig.param_types.
                 super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        pNVar11 = (Newline *)((ulong)((long)pTVar9 - (long)args) >> 3);
        if ((int)pNVar11 != 0) {
          this->indent_ = this->indent_ + 4;
          lVar13 = 0;
          for (uVar12 = 0; uVar12 < ((ulong)((long)pTVar9 - (long)args) >> 3 & 0xffffffff);
              uVar12 = uVar12 + 1) {
            WriteData(this,", ",2);
            if ((uVar12 & 7) == 0 && uVar12 != 0) {
              Write(this);
            }
            local_108._M_dataplus._M_p =
                 (pointer)((long)&((index_to_name.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                          lVar13);
            Write(this,(ParamName *)&local_108);
            args = (uint *)(this->func_->decl).sig.param_types.
                           super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                           super__Vector_impl_data._M_start;
            pTVar9 = (this->func_->decl).sig.param_types.
                     super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                     super__Vector_impl_data._M_finish;
            lVar13 = lVar13 + 0x20;
          }
          Dedent(this,4);
          pNVar11 = extraout_RDX_08;
        }
        t_00 = ");";
        (anonymous_namespace)::CWriter::Write<char_const(&)[3],wabt::(anonymous_namespace)::Newline>
                  ((CWriter *)this,(char (*) [3])0x16d5e1,pNVar11);
        bVar4 = IsSingleUnsharedMemory(this);
        pNVar11 = extraout_RDX_09;
        if (bVar4) {
          RestoreSegueBase(this);
          pNVar11 = extraout_RDX_10;
        }
        if (uVar10 != 0) {
          t_00 = "return ret;";
          (anonymous_namespace)::CWriter::
          Write<char_const(&)[12],wabt::(anonymous_namespace)::Newline>
                    ((CWriter *)this,(char (*) [12])"return ret;",pNVar11);
          pNVar11 = extraout_RDX_11;
        }
        (anonymous_namespace)::CWriter::
        Write<wabt::(anonymous_namespace)::CloseBrace,wabt::(anonymous_namespace)::Newline>
                  ((CWriter *)this,(CloseBrace *)t_00,pNVar11);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::clear(&local_d8->_M_t);
        std::
        _Rb_tree<std::pair<unsigned_int,_wabt::Type>,_std::pair<const_std::pair<unsigned_int,_wabt::Type>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::pair<unsigned_int,_wabt::Type>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::pair<unsigned_int,_wabt::Type>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_wabt::Type>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::clear(&local_e0->_M_t);
        this->func_ = (Func *)0x0;
        goto LAB_00140974;
      case 1:
        Write(this);
        local_108._M_dataplus._M_p._0_4_ = 5;
        u_01 = extraout_RDX_05;
        break;
      case 2:
        Write(this);
        local_108._M_dataplus._M_p._0_4_ = 7;
        u_01 = extraout_RDX_03;
        break;
      case 3:
        Write(this);
        local_108._M_dataplus._M_p._0_4_ = 1;
        u_01 = extraout_RDX_04;
        break;
      case 4:
        local_108._M_dataplus._M_p._0_4_ = 10;
        local_108._M_string_length = (size_type)&internal_name;
        WriteData(this,"= ",2);
        Write(this,(TagSymbol *)&local_108);
        (anonymous_namespace)::CWriter::Write<char_const(&)[2],wabt::(anonymous_namespace)::Newline>
                  ((CWriter *)this,(char (*) [2])0x16c477,u_00);
        goto LAB_00140974;
      default:
switchD_001403ff_default:
        abort();
      }
      t = &local_108;
      local_108._M_string_length = (size_type)&internal_name;
      (anonymous_namespace)::CWriter::
      Write<char_const(&)[8],wabt::(anonymous_namespace)::ExternalInstancePtr,char_const(&)[2],wabt::(anonymous_namespace)::Newline>
                ((CWriter *)this,(char (*) [8])&local_108,u_01,(char (*) [2])args,in_R8);
      (anonymous_namespace)::CWriter::
      Write<wabt::(anonymous_namespace)::CloseBrace,wabt::(anonymous_namespace)::Newline>
                ((CWriter *)this,(CloseBrace *)t,u_02);
LAB_00140974:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&index_to_name);
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
    }
  }
  return;
}

Assistant:

void CWriter::WriteExports(CWriterPhase kind) {
  if (module_->exports.empty())
    return;

  for (const Export* export_ : module_->exports) {
    Write(Newline(), "/* export: '", SanitizeForComment(export_->name), "' */",
          Newline());

    const std::string mangled_name = ExportName(export_->name);
    std::string internal_name;
    std::vector<std::string> index_to_name;

    switch (export_->kind) {
      case ExternalKind::Func: {
        const Func* func = module_->GetFunc(export_->var);
        internal_name = func->name;
        if (kind == CWriterPhase::Declarations) {
          WriteFuncDeclaration(func->decl, mangled_name);
        } else {
          func_ = func;
          local_syms_ = global_syms_;
          local_sym_map_.clear();
          stack_var_sym_map_.clear();
          Write(func_->decl.sig.result_types, " ", mangled_name, "(");
          MakeTypeBindingReverseMapping(func_->GetNumParamsAndLocals(),
                                        func_->bindings, &index_to_name);
          WriteParams(index_to_name);
        }
        break;
      }

      case ExternalKind::Global: {
        const Global* global = module_->GetGlobal(export_->var);
        internal_name = global->name;
        WriteGlobalPtr(*global, mangled_name);
        break;
      }

      case ExternalKind::Memory: {
        const Memory* memory = module_->GetMemory(export_->var);
        internal_name = memory->name;
        WriteMemoryPtr(mangled_name, *memory);
        break;
      }

      case ExternalKind::Table: {
        const Table* table = module_->GetTable(export_->var);
        internal_name = table->name;
        WriteTablePtr(mangled_name, *table);
        break;
      }

      case ExternalKind::Tag: {
        const Tag* tag = module_->GetTag(export_->var);
        internal_name = tag->name;
        if (kind == CWriterPhase::Declarations) {
          Write("extern ");
        }
        Write("const wasm_rt_tag_t ", mangled_name);
        break;
      }

      default:
        WABT_UNREACHABLE;
    }

    if (kind == CWriterPhase::Declarations) {
      Write(";", Newline());
      continue;
    }

    Write(" ");
    switch (export_->kind) {
      case ExternalKind::Func: {
        Write(OpenBrace());
        if (IsSingleUnsharedMemory()) {
          InstallSegueBase(module_->memories[0], true /* save_old_value */);
        }
        auto num_results = func_->GetNumResults();
        if (num_results > 1) {
          Write(func_->decl.sig.result_types, " ret = ");
        } else if (num_results == 1) {
          Write(func_->GetResultType(0), " ret = ");
        }
        Write(ExternalRef(ModuleFieldType::Func, internal_name), "(");

        if (IsImport(internal_name)) {
          Write("instance->",
                GlobalName(ModuleFieldType::Import,
                           import_module_sym_map_[internal_name]));
        } else {
          Write("instance");
        }
        WriteParamSymbols(index_to_name);
        if (IsSingleUnsharedMemory()) {
          RestoreSegueBase();
        }
        if (num_results > 0) {
          Write("return ret;", Newline());
        }
        Write(CloseBrace(), Newline());

        local_sym_map_.clear();
        stack_var_sym_map_.clear();
        func_ = nullptr;
        break;
      }

      case ExternalKind::Global:
        Write(OpenBrace());
        Write("return ",
              ExternalInstancePtr(ModuleFieldType::Global, internal_name), ";",
              Newline());
        Write(CloseBrace(), Newline());
        break;

      case ExternalKind::Memory:
        Write(OpenBrace());
        Write("return ",
              ExternalInstancePtr(ModuleFieldType::Memory, internal_name), ";",
              Newline());
        Write(CloseBrace(), Newline());
        break;

      case ExternalKind::Table:
        Write(OpenBrace());
        Write("return ",
              ExternalInstancePtr(ModuleFieldType::Table, internal_name), ";",
              Newline());
        Write(CloseBrace(), Newline());
        break;

      case ExternalKind::Tag:
        Write("= ", TagSymbol(internal_name), ";", Newline());
        break;

      default:
        WABT_UNREACHABLE;
    }
  }
}